

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O2

void __thiscall ncnn::ObjectsManager::~ObjectsManager(ObjectsManager *this)

{
  pointer ppSVar1;
  SafeOrderList<ncnn::ObjectBox> *this_00;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppSVar1 = (this->object_boxs_table).
                super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                ._M_impl.super__Vector_impl_data._M_start, uVar2 < this->prob_steps;
      uVar2 = uVar2 + 1) {
    this_00 = ppSVar1[uVar2];
    if (this_00 != (SafeOrderList<ncnn::ObjectBox> *)0x0) {
      SafeOrderList<ncnn::ObjectBox>::~SafeOrderList(this_00);
    }
    operator_delete(this_00,0x48);
    (this->object_boxs_table).
    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar2] = (SafeOrderList<ncnn::ObjectBox> *)0x0;
  }
  if ((this->object_boxs_table).
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    (this->object_boxs_table).
    super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar1;
  }
  std::
  _Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::~_Vector_base((_Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                   *)this);
  return;
}

Assistant:

ObjectsManager::~ObjectsManager()
{
    for (size_t i = 0; i < prob_steps; i++)
    {
        delete object_boxs_table[i];
        object_boxs_table[i] = NULL;
    }
    object_boxs_table.clear();
}